

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall CLI::App::_compare_subcommand_names_abi_cxx11_(App *this,App *subcom,App *base)

{
  pointer psVar1;
  App *pAVar2;
  size_type sVar3;
  pointer pcVar4;
  element_type *peVar5;
  bool bVar6;
  bool bVar7;
  string *psVar8;
  string *psVar9;
  pointer psVar10;
  string *unaff_R12;
  char cVar11;
  string *local_d0;
  string local_c0;
  App *local_a0;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_ ==
      '\0') {
    _compare_subcommand_names_abi_cxx11_();
  }
  if (subcom->disabled_ == false) {
    psVar10 = (base->subcommands_).
              super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (base->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar10 != psVar1) {
      local_98 = &subcom->name_;
      local_d0 = unaff_R12;
      local_a0 = this;
      do {
        pAVar2 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        psVar8 = local_d0;
        if (pAVar2 == subcom) {
LAB_001b7501:
          cVar11 = '\0';
        }
        else {
          cVar11 = '\x03';
          if (pAVar2->disabled_ == false) {
            sVar3 = (subcom->name_)._M_string_length;
            if (sVar3 != 0) {
              pcVar4 = (local_98->_M_dataplus)._M_p;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar4,pcVar4 + sVar3)
              ;
              bVar6 = check_name(pAVar2,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              cVar11 = '\x01';
              psVar8 = local_98;
              if (bVar6) goto LAB_001b7506;
            }
            peVar5 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            sVar3 = (peVar5->name_)._M_string_length;
            if (sVar3 != 0) {
              pcVar4 = (peVar5->name_)._M_dataplus._M_p;
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar4,pcVar4 + sVar3)
              ;
              bVar6 = check_name(subcom,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar6) {
                cVar11 = '\x01';
                psVar8 = &((psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->name_;
                goto LAB_001b7506;
              }
            }
            psVar8 = (subcom->aliases_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar9 = (subcom->aliases_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            while( true ) {
              bVar6 = psVar8 == psVar9;
              if (bVar6) break;
              pAVar2 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              pcVar4 = (psVar8->_M_dataplus)._M_p;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,pcVar4,pcVar4 + psVar8->_M_string_length);
              bVar7 = check_name(pAVar2,&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar7) {
                cVar11 = '\x01';
                local_d0 = psVar8;
                goto LAB_001b73fc;
              }
              psVar8 = psVar8 + 1;
            }
            cVar11 = '\x04';
LAB_001b73fc:
            psVar8 = local_d0;
            if (bVar6) {
              peVar5 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              psVar9 = (peVar5->aliases_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (psVar8 = (peVar5->aliases_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; bVar6 = psVar8 == psVar9,
                  !bVar6; psVar8 = psVar8 + 1) {
                pcVar4 = (psVar8->_M_dataplus)._M_p;
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,pcVar4,pcVar4 + psVar8->_M_string_length);
                bVar7 = check_name(subcom,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if (bVar7) {
                  cVar11 = '\x01';
                  goto LAB_001b74d8;
                }
              }
              cVar11 = '\x06';
              psVar8 = local_d0;
LAB_001b74d8:
              if (bVar6) {
                pAVar2 = (psVar10->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                if ((pAVar2->name_)._M_string_length == 0) {
                  psVar9 = _compare_subcommand_names_abi_cxx11_(local_a0,subcom,pAVar2);
                  bVar6 = psVar9->_M_string_length != 0;
                  if (bVar6) {
                    psVar8 = psVar9;
                  }
                  cVar11 = '\x01';
                  if (bVar6) goto LAB_001b7506;
                }
                if ((subcom->name_)._M_string_length != 0) goto LAB_001b7501;
                psVar9 = _compare_subcommand_names_abi_cxx11_
                                   (local_a0,(psVar10->
                                             super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr,subcom);
                cVar11 = psVar9->_M_string_length != 0;
                if ((bool)cVar11) {
                  psVar8 = psVar9;
                }
              }
            }
          }
        }
LAB_001b7506:
        if ((cVar11 != '\x03') && (cVar11 != '\0')) {
          return psVar8;
        }
        psVar10 = psVar10 + 1;
        local_d0 = psVar8;
      } while (psVar10 != psVar1);
    }
  }
  return &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &App::_compare_subcommand_names(const App &subcom,
                                                                               const App &base) const {
    static const std::string estring;
    if(subcom.disabled_) {
        return estring;
    }
    for(const auto &subc : base.subcommands_) {
        if(subc.get() != &subcom) {
            if(subc->disabled_) {
                continue;
            }
            if(!subcom.get_name().empty()) {
                if(subc->check_name(subcom.get_name())) {
                    return subcom.get_name();
                }
            }
            if(!subc->get_name().empty()) {
                if(subcom.check_name(subc->get_name())) {
                    return subc->get_name();
                }
            }
            for(const auto &les : subcom.aliases_) {
                if(subc->check_name(les)) {
                    return les;
                }
            }
            // this loop is needed in case of ignore_underscore or ignore_case on one but not the other
            for(const auto &les : subc->aliases_) {
                if(subcom.check_name(les)) {
                    return les;
                }
            }
            // if the subcommand is an option group we need to check deeper
            if(subc->get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(subcom, *subc);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
            // if the test subcommand is an option group we need to check deeper
            if(subcom.get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(*subc, subcom);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
        }
    }
    return estring;
}